

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic.cpp
# Opt level: O1

void __thiscall Logic::Run(Logic *this,QLearning *q,int *r)

{
  map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_00;
  pointer *ppfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  pointer pfVar5;
  vector<int,_std::allocator<int>_> *__k;
  char cVar6;
  int iVar7;
  time_t tVar8;
  mapped_type *pmVar9;
  pointer piVar10;
  ostream *poVar11;
  long lVar12;
  float *pfVar13;
  undefined8 uVar14;
  long lVar15;
  float *pfVar16;
  long lVar17;
  long lVar18;
  float *pfVar19;
  pointer piVar20;
  uint uVar21;
  bool bVar22;
  float fVar23;
  vector<float,_std::allocator<float>_> max_future;
  vector<int,_std::allocator<int>_> player_pos;
  Player p;
  Mat Picture;
  vector<float,_std::allocator<float>_> local_158;
  undefined8 uStack_140;
  int local_12c;
  float *local_128;
  float *pfStack_120;
  pointer local_118;
  QLearning *local_108;
  _InputArray local_100;
  undefined8 local_e8;
  double local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  double local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  Player local_b8;
  vector<float,_std::allocator<float>_> local_a8 [4];
  int *local_40;
  undefined8 local_38;
  
  this_00 = &q->_q_table;
  local_d8 = &this->_observations;
  local_e8 = 0;
  local_12c = 0;
  local_108 = q;
  local_40 = r;
  do {
    Player::Player(&local_b8,*local_40);
    local_128 = (float *)0x0;
    pfStack_120 = (float *)0x0;
    local_118 = (pointer)0x0;
    local_d0 = 0.0;
    uVar21 = 0;
    do {
      local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_b8.y,local_b8.x);
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&local_128,local_a8,
                 &local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      piVar10 = Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = (long)pfStack_120 - (long)local_128 >> 2;
      lVar12 = (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      piVar20 = (this->_observations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        lVar17 = lVar15;
        if ((lVar15 == lVar18) || (lVar17 = lVar12, lVar12 == lVar18)) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     lVar18,lVar17);
          goto LAB_001053ff;
        }
        piVar20[lVar18] = (int)local_128[lVar18] - piVar10[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 == 1);
      tVar8 = time((time_t *)0x0);
      srand((uint)tVar8);
      iVar7 = rand();
      fVar23 = QLearning::GetEpsilon(local_108);
      if ((float)iVar7 / 2.1474836e+09 <= fVar23) {
        iVar7 = rand();
        this->_action = iVar7 % local_108->_actionSize;
      }
      else {
        pmVar9 = std::
                 map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                 ::operator[](this_00,local_d8);
        std::vector<float,_std::allocator<float>_>::vector(local_a8,pmVar9);
        pfVar13 = local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
        pfVar16 = local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar19 = local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pfVar13 !=
            local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish &&
            local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            pfVar16 = pfVar13;
            if (*pfVar13 < *pfVar19 || *pfVar13 == *pfVar19) {
              pfVar16 = pfVar19;
            }
            pfVar13 = pfVar13 + 1;
            pfVar19 = pfVar16;
          } while (pfVar13 !=
                   local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        this->_action =
             (int)((ulong)((long)pfVar16 -
                          (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      Player::action((vector<int,_std::allocator<int>_> *)local_a8,&local_b8,this->_action);
      pfVar5 = local_118;
      pfVar13 = local_128;
      local_128 = local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pfStack_120 = local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_118 = local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (float *)0x0;
      local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (float *)0x0;
      local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pfVar13 != (float *)0x0) {
        operator_delete(pfVar13,(long)pfVar5 - (long)pfVar13);
      }
      if (local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      piVar20 = (pointer)((long)pfStack_120 - (long)local_128 >> 2);
      if (pfStack_120 == local_128) {
LAB_001053ff:
        uVar14 = 0;
LAB_00105408:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar14,piVar20);
        goto LAB_0010541c;
      }
      piVar10 = (pointer)((long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2);
      if (Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar14 = 0;
        piVar20 = piVar10;
        goto LAB_00105408;
      }
      uVar14 = 1;
      if ((piVar20 < (pointer)0x2) || (piVar20 = piVar10, piVar10 < (pointer)0x2))
      goto LAB_00105408;
      fVar23 = *local_128;
      fVar2 = (float)*Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
      fVar3 = local_128[1];
      fVar4 = (float)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[1];
      if (fVar3 == fVar4 && fVar23 == fVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Goal reached",0xc)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
      }
      else {
        local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = (float *)0x0;
        local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = (float *)0x0;
        local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e0 = (double)((((int)fVar23 + (int)fVar3) - (int)fVar2) - (int)fVar4) + 0.001;
        std::
        transform<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>,std::minus<int>>
                  ();
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        pmVar9 = std::
                 map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
                 ::operator[](this_00,(key_type *)local_a8);
        std::vector<float,_std::allocator<float>_>::operator=(&local_158,pmVar9);
        __k = local_d8;
        std::
        map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::operator[](this_00,local_d8);
        std::
        map<std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::operator[](this_00,__k);
        if ((pointer *)
            local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer *)0x0) {
          operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_d0 = local_d0 + 1.0 / local_e0;
      }
      bVar22 = uVar21 < 199;
      uVar21 = uVar21 + 1;
    } while ((fVar3 != fVar4 || fVar23 != fVar2) && bVar22);
    fVar23 = QLearning::GetEpsilon(local_108);
    local_e0 = (double)CONCAT44(local_e0._4_4_,fVar23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"#----------------------",0x17);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_12c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," Episode Reward: ",0x11);
    poVar11 = std::ostream::_M_insert<double>(local_d0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    QLearning::SetEpsilon(local_108,local_e0._0_4_ * QLearning::_EPS_DECAY);
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uStack_140 = 0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cv::Mat::Mat((Mat *)local_a8,0x140,0xf0,0x10,(Scalar_ *)&local_158);
    cVar6 = cv::Mat::empty();
    if (cVar6 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Could not instantiate the image",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      std::istream::get();
    }
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_,0x1010000);
    local_100.sz.width = 0;
    local_100.sz.height = 0;
    local_100.flags = 0x2010000;
    local_38 = 0x1f4000001f4;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_a8;
    local_100.obj = local_a8;
    cv::resize(0,0,&local_158,&local_100,&local_38,1);
    local_100.sz.width = 0;
    local_100.sz.height = 0;
    local_100.flags = 0x3010000;
    local_100.obj = local_a8;
    if (Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
LAB_00105429:
      uVar14 = std::__throw_out_of_range_fmt
                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          ,local_e8);
      if ((pointer *)
          local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_128 != (float *)0x0) {
        operator_delete(local_128,(long)local_118 - (long)local_128);
      }
      _Unwind_Resume(uVar14);
    }
    if ((ulong)((long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) < 2) {
LAB_0010541c:
      local_e8 = 1;
      goto LAB_00105429;
    }
    local_c0 = *Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start * 0x14;
    local_bc = Player::_goal.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[1] * 0x14;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x406fe00000000000;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uStack_140 = 0;
    cv::circle(&local_100,&local_c0,0x14,(string *)&local_158,2,8,0);
    local_c8 = local_b8.x * 0x14;
    local_c4 = local_b8.y * 0x14;
    local_100.sz.width = 0;
    local_100.sz.height = 0;
    local_100.flags = 0x3010000;
    local_100.obj = local_a8;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x406fe00000000000;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x406fe00000000000;
    local_e8 = 0;
    uStack_140 = 0;
    cv::circle(&local_100,&local_c8,0x14,(string *)&local_158,0xfffffffe,8,0);
    ppfVar1 = &local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppfVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Path planner Reinforcement-Learning","");
    local_100.sz.width = 0;
    local_100.sz.height = 0;
    local_100.flags = 0x1010000;
    local_100.obj = local_a8;
    cv::imshow((string *)&local_158,&local_100);
    if ((pointer *)
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != ppfVar1) {
      operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    cv::waitKey(10);
    local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppfVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Path planner Reinforcement-Learning","");
    cv::destroyWindow((string *)&local_158);
    if ((pointer *)
        local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != ppfVar1) {
      operator_delete(local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
    }
    cv::Mat::~Mat((Mat *)local_a8);
    if (local_128 != (float *)0x0) {
      operator_delete(local_128,(long)local_118 - (long)local_128);
    }
    local_12c = local_12c + 1;
    if (local_12c == 5000) {
      return;
    }
  } while( true );
}

Assistant:

void Logic::Run(QLearning &q, const int &r)
{

    //int k = erl::QLearning::_EPISODES;

    for (int i = 0; i < 5000; i++)
    {
        Player p(r);
        double episode_reward = 0;
        std::vector<int> player_pos;

        for (int j = 0; j < 200; j++)
        {
            player_pos = {p.x, p.y};
            //std::cout << "Previous position " << p.x << " " << p.y << std::endl;
            // std::transform(player_pos.begin(),player_pos.end(),(p.GetGoal()).begin(), std::back_inserter(_observations),std::minus<int>()); //to be completed
            for (int i = 0; i < 2; i++)
            {
                _observations[i] = player_pos.at(i) - Player::_goal.at(i);
            }
            //std::cout<<"Observation<<"<<_observations[0]<< " "<<_observations[1]<<" " <<_observations[2]<<std::endl;
            //
            srand((unsigned)time(NULL));
            //std::cout<<q.GetEpsilon()<<std::endl;

            if (((double)rand() / (RAND_MAX)) > q.GetEpsilon())
            {
                //std::cout<<((double) rand() / (RAND_MAX)) <<std::endl;
                std::vector<float> vec = q._q_table[_observations];
                _action = arg_max(vec);
                //std::cout<<"action selected is "<<_action<<std::endl;
            }
            else
            {
                _action = (int)rand() % (q._actionSize) + 0;
                //std::cout<<"action selected is "<<_action<<std::endl;
                //std::cout<<"exit "<<((double) rand() / (RAND_MAX))<<std::endl;
            }
            player_pos = p.action(_action);
            //Play around with the reward function                                                //Player takes action in this stage
            double reward = 1 / ((player_pos.at(0) -  Player::_goal.at(0)) + (player_pos.at(1) -  Player::_goal.at(1)) + 0.001); //Assuming we had a vector with 2 states
            //std::cout<<reward<<std::endl;

            //std::cout << "New position " << player_pos.at(0) << " " << player_pos.at(1) << std::endl;

            if (player_pos.at(0) ==  Player::_goal.at(0) && player_pos.at(1) ==  Player::_goal.at(1))
            {
                std::cout << "Goal reached" << std::endl;
                break;
            }

            std::vector<int> new_obs;
            std::transform(player_pos.begin(), player_pos.end(), (Player::_goal).begin(), std::back_inserter(new_obs), std::minus<int>());
            //std::cout << "New Observation<<" << new_obs[0] << " " << new_obs[1] << " " << std::endl;

            std::vector<float> max_future;
            try
            {
                max_future = q._q_table[new_obs];
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            std::vector<float>::iterator max_future_q;
            try
            {                                                                             //get all qvalues corresponding next best state
                max_future_q = max_element(std::begin(max_future), std::end(max_future)); // c++11
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout << "Observation<<" << _observations[0] << " " << _observations[1] << std::endl;
            //std::cout << "Action<<" << _action << std::endl;
            //std::cout<<q._q_table[_observations][_action]<<std::endl;
            float current_q;
            try
            {
                float current_q = q._q_table[_observations][_action];
            } //get the best qvalue corresponding next best state
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            //std::cout<<current_q<<std::endl;
            float new_q;
            try
            {
                float new_q = (1 - QLearning::_LEARNING_RATE) * current_q + QLearning::_LEARNING_RATE * (reward + QLearning::_DISCOUNT * (*max_future_q));
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }

            try
            {
                q._q_table[_observations][_action] = new_q;
            }
            catch (const std::exception &er)
            {
                std::cout << "Error caught" << er.what() << std::endl;
            }
            episode_reward += reward;

            //
            //
            //
            //
        }

        float ep = q.GetEpsilon();
        std::cout << "#----------------------" << i << " Episode Reward: " << episode_reward << std::endl;
        q.SetEpsilon(ep * (QLearning::_EPS_DECAY)); //Epsilon Decay;
        //     // Read the image file

        Mat Picture(320, 240, CV_8UC3, cv::Scalar(0, 0, 0));
        // Check for failure
        if (Picture.empty())
        {
            std::cout << "Could not instantiate the image" << std::endl;
            std::cin.get(); //wait for any key press
        }

        resize(Picture, Picture, Size(500, 500));

        //A Parameters x (start in x axes horizontal) y (start in vertical)

        // w (vertical lenght)  h (Horizontal lenght)

        //Rect RectangleToDraw(2, 2, 100, 100);
        //Scaling by 20
        circle(Picture, Point(Player::_goal.at(0)*20, Player::_goal.at(1)*20), 20, Scalar(0, 255, 0), 2, 8, 0);

        Point p1 = Point(20 * p.x, 20 * p.y);
        circle(Picture, p1, 20, Scalar(255, 0, 255), -2, 8, 0);

        imshow("Path planner Reinforcement-Learning", Picture);
        waitKey(10);
        destroyWindow("Path planner Reinforcement-Learning");
    }
}